

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::lts_20250127::Mutex::ReaderUnlock(Mutex *this)

{
  bool bVar1;
  long lVar2;
  intptr_t clear;
  intptr_t v;
  Mutex *this_local;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  long local_30;
  undefined4 local_28;
  undefined4 local_24;
  long local_20;
  intptr_t *local_18;
  Mutex *local_10;
  
  v = (intptr_t)this;
  DebugOnlyLockLeave(this);
  local_44 = 0;
  ___b = this;
  local_48 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_44 - 1U < 2) {
    this_local = (Mutex *)(this->mu_).super___atomic_base<long>._M_i;
  }
  else if (local_44 == 5) {
    this_local = (Mutex *)(this->mu_).super___atomic_base<long>._M_i;
  }
  else {
    this_local = (Mutex *)(this->mu_).super___atomic_base<long>._M_i;
  }
  clear = (intptr_t)this_local;
  if (((ulong)this_local & 9) == 1) {
    do {
      if ((clear & 0x15U) != 1) {
        UnlockSlow(this,(SynchWaitParams *)0x0);
        return;
      }
      bVar1 = ExactlyOneReader(clear);
      local_30 = clear - ((ulong)bVar1 | 0x100);
      local_18 = &clear;
      local_24 = 3;
      local_28 = 0;
      LOCK();
      lVar2 = (this->mu_).super___atomic_base<long>._M_i;
      local_31 = clear == lVar2;
      if ((bool)local_31) {
        (this->mu_).super___atomic_base<long>._M_i = local_30;
        lVar2 = clear;
      }
      UNLOCK();
      clear = lVar2;
      local_20 = local_30;
      local_10 = this;
    } while (!(bool)local_31);
    return;
  }
  __assert_fail("(v & (kMuWriter | kMuReader)) == kMuReader",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x6f7,"void absl::Mutex::ReaderUnlock()");
}

Assistant:

void Mutex::ReaderUnlock() {
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, __tsan_mutex_read_lock);
  DebugOnlyLockLeave(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  assert((v & (kMuWriter | kMuReader)) == kMuReader);
  for (;;) {
    if (ABSL_PREDICT_FALSE((v & (kMuReader | kMuWait | kMuEvent)) !=
                           kMuReader)) {
      this->UnlockSlow(nullptr /*no waitp*/);  // take slow path
      break;
    }
    // fast reader release (reader with no waiters)
    intptr_t clear = ExactlyOneReader(v) ? kMuReader | kMuOne : kMuOne;
    if (ABSL_PREDICT_TRUE(
            mu_.compare_exchange_strong(v, v - clear, std::memory_order_release,
                                        std::memory_order_relaxed))) {
      break;
    }
  }
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, __tsan_mutex_read_lock);
}